

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

void __thiscall ON_SubDHeap::Clear(ON_SubDHeap *this)

{
  tagWSItem *ptVar1;
  ulong local_30;
  size_t i;
  size_t frag_size_count;
  tagWSItem *next;
  tagWSItem *p;
  ON_SubDHeap *this_local;
  
  next = this->m_ws;
  this->m_ws = (tagWSItem *)0x0;
  while (next != (tagWSItem *)0x0) {
    ptVar1 = next->m_next;
    onfree(next);
    next = ptVar1;
  }
  ON_FixedSizePool::ReturnAll(&this->m_fspv);
  ON_FixedSizePool::ReturnAll(&this->m_fspe);
  ON_FixedSizePool::ReturnAll(&this->m_fspf);
  ON_FixedSizePool::ReturnAll(&this->m_fsp5);
  ON_FixedSizePool::ReturnAll(&this->m_fsp9);
  ON_FixedSizePool::ReturnAll(&this->m_fsp17);
  this->m_full_fragment_display_density = 0;
  this->m_full_fragment_count_estimate = 0;
  this->m_part_fragment_count_estimate = 0;
  ON_FixedSizePool::ReturnAll(&this->m_fsp_full_fragments);
  ON_FixedSizePool::ReturnAll(&this->m_fsp_part_fragments);
  ON_FixedSizePool::ReturnAll(&this->m_fsp_oddball_fragments);
  ON_FixedSizePool::ReturnAll(&this->m_fsp_limit_curves);
  for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
    this->m_unused_fragments[local_30] = (ON_FixedSizePoolElement *)0x0;
  }
  this->m_unused_vertex = (ON_SubDVertex *)0x0;
  this->m_unused_edge = (ON_SubDEdge *)0x0;
  this->m_unused_face = (ON_SubDFace *)0x0;
  this->m_max_vertex_id = 0;
  this->m_max_edge_id = 0;
  this->m_max_face_id = 0;
  return;
}

Assistant:

void ON_SubDHeap::Clear()
{
  class tagWSItem* p = m_ws;
  m_ws = 0;
  while (p)
  {
    class tagWSItem* next = p->m_next;
    onfree(p);
    p = next;
  }

  m_fspv.ReturnAll();
  m_fspe.ReturnAll();
  m_fspf.ReturnAll();

  m_fsp5.ReturnAll();
  m_fsp9.ReturnAll();
  m_fsp17.ReturnAll();

  m_full_fragment_display_density = 0;
  m_full_fragment_count_estimate = 0;
  m_part_fragment_count_estimate = 0;

  m_fsp_full_fragments.ReturnAll();
  m_fsp_part_fragments.ReturnAll();
  m_fsp_oddball_fragments.ReturnAll();
  m_fsp_limit_curves.ReturnAll();

  const size_t frag_size_count = sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]);
  for (size_t i = 0; i < frag_size_count; ++i)
    m_unused_fragments[i] = nullptr;

  m_unused_vertex = nullptr;
  m_unused_edge = nullptr;
  m_unused_face = nullptr;

  m_max_vertex_id = 0;
  m_max_edge_id = 0;
  m_max_face_id = 0;
}